

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

bool __thiscall JSONNode::empty(JSONNode *this)

{
  internalJSONNode *piVar1;
  bool bVar2;
  allocator local_31;
  json_string local_30;
  
  piVar1 = this->internal;
  std::__cxx11::string::string((string *)&local_30,"no internal",&local_31);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  bVar2 = internalJSONNode::empty(this->internal);
  return bVar2;
}

Assistant:

inline bool JSONNode::empty(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    return internal -> empty();
}